

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O3

void __thiscall
CGameContext::SendVoteStatus(CGameContext *this,int ClientID,int Total,int Yes,int No)

{
  long in_FS_OFFSET;
  CNetMsg_Sv_VoteStatus local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_Pass = Total - (Yes + No);
  local_18.m_Yes = Yes;
  local_18.m_No = No;
  local_18.m_Total = Total;
  IServer::SendPackMsg<CNetMsg_Sv_VoteStatus>(this->m_pServer,&local_18,1,ClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendVoteStatus(int ClientID, int Total, int Yes, int No)
{
	CNetMsg_Sv_VoteStatus Msg = {0};
	Msg.m_Total = Total;
	Msg.m_Yes = Yes;
	Msg.m_No = No;
	Msg.m_Pass = Total - (Yes+No);

	Server()->SendPackMsg(&Msg, MSGFLAG_VITAL, ClientID);

}